

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
Shell::assertModule(Result<wasm::Ok> *__return_storage_ptr__,Shell *this,AssertModule *assn)

{
  undefined8 *puVar1;
  ModuleAssertionType MVar2;
  undefined1 *puVar3;
  undefined1 local_c0 [8];
  Result<std::shared_ptr<wasm::Module>_> wasm;
  Result<wasm::Ok> valid;
  Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
  instance;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  makeModule((Result<std::shared_ptr<wasm::Module>_> *)local_c0,this,&assn->wasm);
  if (wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_u._24_1_ == '\x01')
  {
    if (assn->type - Malformed < 2) {
      (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
      goto LAB_00146255;
    }
    wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ =
         (undefined1 *)
         ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               &wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_index,
               local_c0,wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                        super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_u.
                        _0_8_ + (long)local_c0);
  }
  else {
    if (assn->type != Malformed) {
      validateModule((Result<wasm::Ok> *)
                     &wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                      super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                      super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                      super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                      super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                      super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                      _M_index,this,(Module *)local_c0);
      if (valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
        if (assn->type == Invalid) {
          (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
        }
        else {
          valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
               (undefined1 *)
               ((long)&instance.val.
                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       ._M_u + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)
                     &valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index,
                     wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_,
                     valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ +
                     wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                     super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_);
LAB_00146112:
          puVar3 = (undefined1 *)
                   ((long)&instance.val.
                           super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           .
                           super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                           ._M_u + 8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
          if ((undefined1 *)
              valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == puVar3) {
            *puVar1 = CONCAT71(instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               ._M_u._9_7_,
                               instance.val.
                               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               .
                               super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                               ._M_u._M_first._M_storage._M_storage[8]);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x18) =
                 instance.val.
                 super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 ._M_u._16_8_;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
                 valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>
                              .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10) =
                 CONCAT71(instance.val.
                          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          ._M_u._9_7_,
                          instance.val.
                          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          .
                          super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                          ._M_u._M_first._M_storage._M_storage[8]);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8) =
               instance.val.
               super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               .
               super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
               ._M_u._0_8_;
          instance.val.
          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          ._M_u._0_8_ = 0;
          instance.val.
          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          ._M_u._M_first._M_storage._M_storage[8] = '\0';
          (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\x01';
          valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = puVar3;
        }
      }
      else {
        if (assn->type == Invalid) {
          valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ =
               (long)&instance.val.
                      super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      .
                      super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      .
                      super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      .
                      super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      .
                      super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      .
                      super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                      ._M_u + 8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)
                     &valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index,
                     "expected invalid module","");
          goto LAB_00146112;
        }
        instantiate((Result<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>_>
                     *)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index,this,
                    (Module *)local_c0);
        MVar2 = assn->type;
        if (instance.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._M_u._M_first._M_storage._M_storage[0x18] == '\x01') {
          if ((MVar2 != Unlinkable) && (MVar2 != Trap)) {
            instance.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._32_8_ = &local_38;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)
                       &instance.val.
                        super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        ._M_index,
                       valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_,
                       instance.val.
                       super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       .
                       super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                       ._M_u._0_8_ +
                       valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_);
            goto LAB_00146200;
          }
          (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\0';
        }
        else {
          if (MVar2 == Trap) {
            instance.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._32_8_ = &local_38;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &instance.val.
                        super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        ._M_index,"expected instantiation to trap","");
          }
          else {
            if (MVar2 != Unlinkable) {
              ::wasm::handle_unreachable
                        ("unexpected module assertion",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp"
                         ,0x1b8);
            }
            instance.val.
            super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            .
            super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
            ._32_8_ = &local_38;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &instance.val.
                        super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        .
                        super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                        ._M_index,"expected unlinkable module","");
          }
LAB_00146200:
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
          if ((undefined1 *)
              instance.val.
              super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
              .
              super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
              .
              super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
              .
              super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
              .
              super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
              ._32_8_ == &local_38) {
            *puVar1 = CONCAT71(uStack_37,local_38);
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x18) = uStack_30;
          }
          else {
            *(undefined8 *)
             &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
                 instance.val.
                 super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 .
                 super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                 ._32_8_;
            *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>
                              .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10) =
                 CONCAT71(uStack_37,local_38);
          }
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8) = local_40;
          local_38 = 0;
          (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\x01';
          instance.val.
          super__Variant_base<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_assign_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Move_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Copy_ctor_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          .
          super__Variant_storage_alias<std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
          ._32_8_ = &local_38;
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
        ::~_Variant_storage((_Variant_storage<false,_std::pair<std::shared_ptr<wasm::ShellExternalInterface>,_std::shared_ptr<wasm::ModuleRunner>_>,_wasm::Err>
                             *)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index);
      }
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 &wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                  super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                  super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                  super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                  super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                  super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_index);
      goto LAB_00146255;
    }
    wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
    super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ =
         (long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
                super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._M_index,
               "expected malformed module","");
  }
  puVar3 = (undefined1 *)
           ((long)&valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8);
  puVar1 = (undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10);
  *(undefined8 **)
   &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
  if ((undefined1 *)
      wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
      super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ == puVar3) {
    *puVar1 = CONCAT71(valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                       valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x18) =
         valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
         super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>
         .super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
         super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
  }
  else {
    *(undefined8 *)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
         wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
         super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
         super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
         super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
         super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
         super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_;
    *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 0x10) =
         CONCAT71(valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                  valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
  }
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u + 8) =
       valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.
       super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
       super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
  valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._0_8_ = 0;
  valid.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u
  ._8_1_ = 0;
  (__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
  super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_index = '\x01';
  wasm.val.super__Variant_base<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Move_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Copy_assign_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Move_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Copy_ctor_alias<std::shared_ptr<wasm::Module>,_wasm::Err>.
  super__Variant_storage_alias<std::shared_ptr<wasm::Module>,_wasm::Err>._32_8_ = puVar3;
LAB_00146255:
  std::__detail::__variant::_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_std::shared_ptr<wasm::Module>,_wasm::Err> *)local_c0);
  return __return_storage_ptr__;
}

Assistant:

Result<> assertModule(AssertModule& assn) {
    auto wasm = makeModule(assn.wasm);
    if (const auto* err = wasm.getErr()) {
      if (assn.type == ModuleAssertionType::Malformed ||
          assn.type == ModuleAssertionType::Invalid) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Malformed) {
      return Err{"expected malformed module"};
    }

    auto valid = validateModule(**wasm);
    if (auto* err = valid.getErr()) {
      if (assn.type == ModuleAssertionType::Invalid) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Invalid) {
      return Err{"expected invalid module"};
    }

    auto instance = instantiate(**wasm);
    if (auto* err = instance.getErr()) {
      if (assn.type == ModuleAssertionType::Unlinkable ||
          assn.type == ModuleAssertionType::Trap) {
        return Ok{};
      }
      return Err{err->msg};
    }

    if (assn.type == ModuleAssertionType::Unlinkable) {
      return Err{"expected unlinkable module"};
    }
    if (assn.type == ModuleAssertionType::Trap) {
      return Err{"expected instantiation to trap"};
    }

    WASM_UNREACHABLE("unexpected module assertion");
  }